

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rds_describe_db_instance_attribute.cc
# Opt level: O0

void anon_unknown.dwarf_c3853::Json2Type
               (Value *value,RdsDescribeDBInstanceAttributeDBInstanceAttributeType *item)

{
  bool bVar1;
  Int IVar2;
  Value *pVVar3;
  Json2Array<aliyun::RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType> local_3b9;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  RdsDescribeDBInstanceAttributeDBInstanceAttributeType *local_18;
  RdsDescribeDBInstanceAttributeDBInstanceAttributeType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (RdsDescribeDBInstanceAttributeDBInstanceAttributeType *)value;
  bVar1 = Json::Value::isMember(value,"InsId");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"InsId");
    IVar2 = Json::Value::asInt(pVVar3);
    local_18->ins_id = IVar2;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"DBInstanceId");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"DBInstanceId");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->db_instance_id,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"PayType");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"PayType");
    Json::Value::asString_abi_cxx11_(&local_58,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->pay_type,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"DBInstanceClassType");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"DBInstanceClassType");
    Json::Value::asString_abi_cxx11_(&local_78,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->db_instance_class_type,(string *)&local_78)
    ;
    std::__cxx11::string::~string((string *)&local_78);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"DBInstanceType");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"DBInstanceType");
    Json::Value::asString_abi_cxx11_(&local_98,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->db_instance_type,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"RegionId");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"RegionId");
    Json::Value::asString_abi_cxx11_(&local_b8,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->region_id,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"ConnectionString");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"ConnectionString");
    Json::Value::asString_abi_cxx11_(&local_d8,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->connection_string,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Port");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"Port");
    Json::Value::asString_abi_cxx11_(&local_f8,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->port,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Engine");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"Engine");
    Json::Value::asString_abi_cxx11_(&local_118,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->engine,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"EngineVersion");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"EngineVersion");
    Json::Value::asString_abi_cxx11_(&local_138,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->engine_version,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"DBInstanceClass");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"DBInstanceClass");
    Json::Value::asString_abi_cxx11_(&local_158,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->db_instance_class,(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"DBInstanceMemory");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"DBInstanceMemory");
    IVar2 = Json::Value::asInt(pVVar3);
    local_18->db_instance_memory = (long)IVar2;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"DBInstanceStorage");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"DBInstanceStorage");
    IVar2 = Json::Value::asInt(pVVar3);
    local_18->db_instance_storage = IVar2;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"DBInstanceNetType");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"DBInstanceNetType");
    Json::Value::asString_abi_cxx11_(&local_178,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->db_instance_net_type,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"DBInstanceStatus");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"DBInstanceStatus");
    Json::Value::asString_abi_cxx11_(&local_198,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->db_instance_status,(string *)&local_198);
    std::__cxx11::string::~string((string *)&local_198);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"DBInstanceDescription");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"DBInstanceDescription");
    Json::Value::asString_abi_cxx11_(&local_1b8,pVVar3);
    std::__cxx11::string::operator=
              ((string *)&local_18->db_instance_description,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"LockMode");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"LockMode");
    Json::Value::asString_abi_cxx11_(&local_1d8,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->lock_mode,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"LockReason");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"LockReason");
    Json::Value::asString_abi_cxx11_(&local_1f8,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->lock_reason,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"ReadDelayTime");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"ReadDelayTime");
    Json::Value::asString_abi_cxx11_(&local_218,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->read_delay_time,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"DBMaxQuantity");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"DBMaxQuantity");
    IVar2 = Json::Value::asInt(pVVar3);
    local_18->db_max_quantity = IVar2;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"AccountMaxQuantity");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"AccountMaxQuantity");
    IVar2 = Json::Value::asInt(pVVar3);
    local_18->account_max_quantity = IVar2;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"CreationTime");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"CreationTime");
    Json::Value::asString_abi_cxx11_(&local_238,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->creation_time,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"ExpireTime");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"ExpireTime");
    Json::Value::asString_abi_cxx11_(&local_258,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->expire_time,(string *)&local_258);
    std::__cxx11::string::~string((string *)&local_258);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"MaintainTime");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"MaintainTime");
    Json::Value::asString_abi_cxx11_(&local_278,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->maintain_time,(string *)&local_278);
    std::__cxx11::string::~string((string *)&local_278);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"AvailabilityValue");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"AvailabilityValue");
    Json::Value::asString_abi_cxx11_(&local_298,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->availability_value,(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"MaxIOPS");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"MaxIOPS");
    IVar2 = Json::Value::asInt(pVVar3);
    local_18->max_io_ps = IVar2;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"MaxConnections");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"MaxConnections");
    IVar2 = Json::Value::asInt(pVVar3);
    local_18->max_connections = IVar2;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"MasterInstanceId");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"MasterInstanceId");
    Json::Value::asString_abi_cxx11_(&local_2b8,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->master_instance_id,(string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"IncrementSourceDBInstanceId");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"IncrementSourceDBInstanceId");
    Json::Value::asString_abi_cxx11_(&local_2d8,pVVar3);
    std::__cxx11::string::operator=
              ((string *)&local_18->increment_source_db_instance_id,(string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"GuardDBInstanceId");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"GuardDBInstanceId");
    Json::Value::asString_abi_cxx11_(&local_2f8,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->guard_db_instance_id,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"TempDBInstanceId");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"TempDBInstanceId");
    Json::Value::asString_abi_cxx11_(&local_318,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->temp_db_instance_id,(string *)&local_318);
    std::__cxx11::string::~string((string *)&local_318);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"SecurityIPList");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"SecurityIPList");
    Json::Value::asString_abi_cxx11_(&local_338,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->security_ip_list,(string *)&local_338);
    std::__cxx11::string::~string((string *)&local_338);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"ZoneId");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"ZoneId");
    Json::Value::asString_abi_cxx11_(&local_358,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->zone_id,(string *)&local_358);
    std::__cxx11::string::~string((string *)&local_358);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"InstanceNetworkType");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"InstanceNetworkType");
    Json::Value::asString_abi_cxx11_(&local_378,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->instance_network_type,(string *)&local_378)
    ;
    std::__cxx11::string::~string((string *)&local_378);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"VpcId");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"VpcId");
    Json::Value::asString_abi_cxx11_(&local_398,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->vpc_id,(string *)&local_398);
    std::__cxx11::string::~string((string *)&local_398);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"ConnectionMode");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"ConnectionMode");
    Json::Value::asString_abi_cxx11_(&local_3b8,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->connection_mode,(string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"ReadOnlyDBInstanceIds");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"ReadOnlyDBInstanceIds");
    bVar1 = Json::Value::isMember(pVVar3,"ReadOnlyDBInstanceId");
    if (bVar1) {
      pVVar3 = Json::Value::operator[]((Value *)item_local,"ReadOnlyDBInstanceIds");
      pVVar3 = Json::Value::operator[](pVVar3,"ReadOnlyDBInstanceId");
      Json2Array<aliyun::RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType>::Json2Array
                (&local_3b9,pVVar3,&local_18->read_only_db_instance_ids);
    }
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, RdsDescribeDBInstanceAttributeDBInstanceAttributeType* item) {
  if(value.isMember("InsId")) {
    item->ins_id = value["InsId"].asInt();
  }
  if(value.isMember("DBInstanceId")) {
    item->db_instance_id = value["DBInstanceId"].asString();
  }
  if(value.isMember("PayType")) {
    item->pay_type = value["PayType"].asString();
  }
  if(value.isMember("DBInstanceClassType")) {
    item->db_instance_class_type = value["DBInstanceClassType"].asString();
  }
  if(value.isMember("DBInstanceType")) {
    item->db_instance_type = value["DBInstanceType"].asString();
  }
  if(value.isMember("RegionId")) {
    item->region_id = value["RegionId"].asString();
  }
  if(value.isMember("ConnectionString")) {
    item->connection_string = value["ConnectionString"].asString();
  }
  if(value.isMember("Port")) {
    item->port = value["Port"].asString();
  }
  if(value.isMember("Engine")) {
    item->engine = value["Engine"].asString();
  }
  if(value.isMember("EngineVersion")) {
    item->engine_version = value["EngineVersion"].asString();
  }
  if(value.isMember("DBInstanceClass")) {
    item->db_instance_class = value["DBInstanceClass"].asString();
  }
  if(value.isMember("DBInstanceMemory")) {
    item->db_instance_memory = value["DBInstanceMemory"].asInt();
  }
  if(value.isMember("DBInstanceStorage")) {
    item->db_instance_storage = value["DBInstanceStorage"].asInt();
  }
  if(value.isMember("DBInstanceNetType")) {
    item->db_instance_net_type = value["DBInstanceNetType"].asString();
  }
  if(value.isMember("DBInstanceStatus")) {
    item->db_instance_status = value["DBInstanceStatus"].asString();
  }
  if(value.isMember("DBInstanceDescription")) {
    item->db_instance_description = value["DBInstanceDescription"].asString();
  }
  if(value.isMember("LockMode")) {
    item->lock_mode = value["LockMode"].asString();
  }
  if(value.isMember("LockReason")) {
    item->lock_reason = value["LockReason"].asString();
  }
  if(value.isMember("ReadDelayTime")) {
    item->read_delay_time = value["ReadDelayTime"].asString();
  }
  if(value.isMember("DBMaxQuantity")) {
    item->db_max_quantity = value["DBMaxQuantity"].asInt();
  }
  if(value.isMember("AccountMaxQuantity")) {
    item->account_max_quantity = value["AccountMaxQuantity"].asInt();
  }
  if(value.isMember("CreationTime")) {
    item->creation_time = value["CreationTime"].asString();
  }
  if(value.isMember("ExpireTime")) {
    item->expire_time = value["ExpireTime"].asString();
  }
  if(value.isMember("MaintainTime")) {
    item->maintain_time = value["MaintainTime"].asString();
  }
  if(value.isMember("AvailabilityValue")) {
    item->availability_value = value["AvailabilityValue"].asString();
  }
  if(value.isMember("MaxIOPS")) {
    item->max_io_ps = value["MaxIOPS"].asInt();
  }
  if(value.isMember("MaxConnections")) {
    item->max_connections = value["MaxConnections"].asInt();
  }
  if(value.isMember("MasterInstanceId")) {
    item->master_instance_id = value["MasterInstanceId"].asString();
  }
  if(value.isMember("IncrementSourceDBInstanceId")) {
    item->increment_source_db_instance_id = value["IncrementSourceDBInstanceId"].asString();
  }
  if(value.isMember("GuardDBInstanceId")) {
    item->guard_db_instance_id = value["GuardDBInstanceId"].asString();
  }
  if(value.isMember("TempDBInstanceId")) {
    item->temp_db_instance_id = value["TempDBInstanceId"].asString();
  }
  if(value.isMember("SecurityIPList")) {
    item->security_ip_list = value["SecurityIPList"].asString();
  }
  if(value.isMember("ZoneId")) {
    item->zone_id = value["ZoneId"].asString();
  }
  if(value.isMember("InstanceNetworkType")) {
    item->instance_network_type = value["InstanceNetworkType"].asString();
  }
  if(value.isMember("VpcId")) {
    item->vpc_id = value["VpcId"].asString();
  }
  if(value.isMember("ConnectionMode")) {
    item->connection_mode = value["ConnectionMode"].asString();
  }
  if(value.isMember("ReadOnlyDBInstanceIds") && value["ReadOnlyDBInstanceIds"].isMember("ReadOnlyDBInstanceId")) {
    Json2Array<RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType>(value["ReadOnlyDBInstanceIds"]["ReadOnlyDBInstanceId"], &item->read_only_db_instance_ids);
  }
}